

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O3

QByteArray * QFileSystemEngine::id(QByteArray *__return_storage_ptr__,int fd)

{
  int iVar1;
  long in_FS_OFFSET;
  stat64 statResult;
  QByteArray local_c8;
  stat64 local_b0;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_b0,0xaa,0x90);
  iVar1 = fstat64(fd,&local_b0);
  if (iVar1 == 0) {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::number(__return_storage_ptr__,local_b0.st_dev,0x10);
    QByteArray::append(__return_storage_ptr__,':');
    QByteArray::number(&local_c8,local_b0.st_ino,10);
    QByteArray::append(__return_storage_ptr__,&local_c8);
    if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_003b6520:
      __stack_chk_fail();
    }
  }
  else {
    qErrnoWarning("fstat() failed for fd %d",fd);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_003b6520;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QFileSystemEngine::id(int fd)
{
    QT_STATBUF statResult;
    if (QT_FSTAT(fd, &statResult)) {
        qErrnoWarning("fstat() failed for fd %d", fd);
        return QByteArray();
    }
    QByteArray result = QByteArray::number(quint64(statResult.st_dev), 16);
    result += ':';
    result += QByteArray::number(quint64(statResult.st_ino));
    return result;
}